

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall xmrig::CpuBackend::handleRequest(CpuBackend *this,IApiRequest *request)

{
  CpuBackendPrivate *pCVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_50 [24];
  undefined4 local_38;
  
  iVar2 = (*request->_vptr_IApiRequest[0xe])(request);
  if (iVar2 == 1) {
    iVar2 = (*request->_vptr_IApiRequest[0xd])(request);
    local_50._16_8_ = "hugepages";
    local_38 = 9;
    pCVar1 = this->d_ptr;
    uVar3 = (*request->_vptr_IApiRequest[10])(request);
    (*request->_vptr_IApiRequest[0xc])(request);
    CpuBackendPrivate::hugePages((CpuBackendPrivate *)local_50,(int)pCVar1,(Document *)(ulong)uVar3)
    ;
    iVar4 = (*request->_vptr_IApiRequest[0xc])(request);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var,iVar2),(StringRefType *)(local_50 + 0x10),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_50,
              *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
               (CONCAT44(extraout_var_00,iVar4) + 0x10));
  }
  return;
}

Assistant:

void xmrig::CpuBackend::handleRequest(IApiRequest &request)
{
    if (request.type() == IApiRequest::REQ_SUMMARY) {
        request.reply().AddMember("hugepages", d_ptr->hugePages(request.version(), request.doc()), request.doc().GetAllocator());
    }
}